

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  undefined8 *in_RDI;
  bool bVar3;
  char *original_dir;
  int gtest_retval;
  ExecDeathTestArgs *args;
  char *in_stack_fffffffffffffd10;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_stack_fffffffffffffd20;
  string *message;
  allocator<char> *in_stack_fffffffffffffd30;
  int *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd48;
  char local_2a9 [232];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c1 [4];
  char *local_140;
  undefined4 local_134;
  string local_f9 [7];
  int local_14;
  undefined8 *local_10;
  
  local_10 = in_RDI;
  while( true ) {
    do {
      local_14 = close(*(int *)(local_10 + 1));
      bVar3 = false;
      if (local_14 == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_14 == -1) break;
    bVar3 = AlwaysFalse();
    if (!bVar3) {
      UnitTest::GetInstance();
      local_140 = UnitTest::original_working_dir((UnitTest *)0x14d229);
      iVar1 = chdir(local_140);
      if (iVar1 == 0) {
        execv(*(char **)*local_10,(char **)*local_10);
        __rhs = local_2a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                   in_stack_fffffffffffffd30);
        std::operator+(in_stack_fffffffffffffd18,__rhs);
        std::operator+(in_stack_fffffffffffffd18,__rhs);
        std::operator+(in_stack_fffffffffffffd18,__rhs);
        std::operator+(in_stack_fffffffffffffd18,__rhs);
        GetLastErrnoDescription_abi_cxx11_();
        std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
        DeathTestAbort(in_stack_fffffffffffffd20);
      }
      __lhs = local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,
                 in_stack_fffffffffffffd30);
      std::operator+(__lhs,in_stack_fffffffffffffd10);
      std::operator+(__lhs,in_stack_fffffffffffffd10);
      GetLastErrnoDescription_abi_cxx11_();
      std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
      DeathTestAbort(in_stack_fffffffffffffd20);
    }
  }
  message = local_f9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd40,(char *)in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  local_134 = 0x4a1;
  StreamableToString<int>(in_stack_fffffffffffffd38);
  std::operator+(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  std::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  DeathTestAbort(message);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir +
                   "\") failed: " + GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " + GetLastErrnoDescription());
  return EXIT_FAILURE;
}